

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sx_strnequalnocase(char *a,char *b,int num)

{
  char cVar1;
  char cVar2;
  int local_58;
  int local_54;
  int local_50;
  int i;
  int var__b_1;
  int var__a_1;
  int blen;
  int var__b;
  int var__a;
  int alen;
  int _blen;
  int _alen;
  int num_local;
  char *b_local;
  char *a_local;
  
  local_54 = sx_strlen(a);
  local_58 = sx_strlen(b);
  if (num < local_54) {
    local_54 = num;
  }
  if (num < local_58) {
    local_58 = num;
  }
  if (local_54 == local_58) {
    for (local_50 = 0; local_50 < local_54; local_50 = local_50 + 1) {
      cVar1 = sx_tolowerchar(a[local_50]);
      cVar2 = sx_tolowerchar(b[local_50]);
      if (cVar1 != cVar2) {
        return false;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool sx_strnequalnocase(const char* SX_RESTRICT a, const char* SX_RESTRICT b, int num)
{
    int _alen = sx_strlen(a);
    int _blen = sx_strlen(b);
    int alen = sx_min(num, _alen);
    int blen = sx_min(num, _blen);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (sx_tolowerchar(a[i]) != sx_tolowerchar(b[i]))
            return false;
    }
    return true;
}